

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filterintra_sse4.c
# Opt level: O3

void av1_filter_intra_predictor_sse4_1
               (uint8_t *dst,ptrdiff_t stride,TX_SIZE tx_size,uint8_t *above,uint8_t *left,int mode)

{
  int iVar1;
  uint uVar2;
  char cVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  int iVar12;
  uint7 uVar13;
  undefined7 in_register_00000011;
  long lVar14;
  uint8_t *puVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  ulong uVar23;
  undefined1 auVar24 [16];
  short sVar25;
  short sVar28;
  short sVar29;
  short sVar30;
  short sVar31;
  short sVar32;
  short sVar33;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  short sVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  
  if ((0x2021UL >> ((ulong)tx_size & 0x3f) & 1) == 0) {
    uVar23 = (ulong)(uint)((int)CONCAT71(in_register_00000011,tx_size) << 2);
    auVar24 = *(undefined1 (*) [16])av1_filter_intra_taps[mode];
    auVar81._0_4_ = *(uint *)left;
    auVar26._8_4_ = auVar81._0_4_;
    auVar26._0_8_ = *(undefined8 *)(above + -1);
    auVar26._12_4_ = 0;
    auVar27 = pshufb(auVar26,_DAT_005604e0);
    auVar39 = *(undefined1 (*) [16])(av1_filter_intra_taps[mode] + 2);
    auVar40 = pmaddubsw(auVar27,auVar24);
    auVar26 = pmaddubsw(auVar27,auVar39);
    auVar26 = phaddw(auVar40,auVar26);
    iVar1 = *(int *)((long)tx_size_wide + uVar23);
    lVar18 = (long)iVar1;
    auVar41 = phaddw(auVar26,auVar26);
    auVar26 = *(undefined1 (*) [16])(av1_filter_intra_taps[mode] + 4);
    auVar40 = *(undefined1 (*) [16])(av1_filter_intra_taps[mode] + 6);
    auVar49 = pmaddubsw(auVar27,auVar26);
    auVar27 = pmaddubsw(auVar27,auVar40);
    auVar49 = phaddw(auVar49,auVar27);
    uVar2 = *(uint *)((long)tx_size_high + uVar23);
    auVar27 = pmovsxbw(auVar27,0x808080808080808);
    sVar25 = auVar27._0_2_;
    auVar42._0_2_ = auVar41._0_2_ + sVar25;
    sVar28 = auVar27._2_2_;
    auVar42._2_2_ = auVar41._2_2_ + sVar28;
    sVar29 = auVar27._4_2_;
    auVar42._4_2_ = auVar41._4_2_ + sVar29;
    sVar30 = auVar27._6_2_;
    auVar42._6_2_ = auVar41._6_2_ + sVar30;
    sVar31 = auVar27._8_2_;
    auVar42._8_2_ = auVar41._8_2_ + sVar31;
    sVar32 = auVar27._10_2_;
    auVar42._10_2_ = auVar41._10_2_ + sVar32;
    sVar33 = auVar27._12_2_;
    auVar42._12_2_ = auVar41._12_2_ + sVar33;
    sVar34 = auVar27._14_2_;
    auVar42._14_2_ = auVar41._14_2_ + sVar34;
    auVar27 = psraw(auVar42,4);
    auVar41 = phaddw(auVar49,auVar49);
    sVar4 = auVar27._0_2_;
    sVar5 = auVar27._2_2_;
    sVar6 = auVar27._4_2_;
    sVar7 = auVar27._6_2_;
    *(uint *)dst = CONCAT13((0 < sVar7) * (sVar7 < 0x100) * auVar27[6] - (0xff < sVar7),
                            CONCAT12((0 < sVar6) * (sVar6 < 0x100) * auVar27[4] - (0xff < sVar6),
                                     CONCAT11((0 < sVar5) * (sVar5 < 0x100) * auVar27[2] -
                                              (0xff < sVar5),
                                              (0 < sVar4) * (sVar4 < 0x100) * auVar27[0] -
                                              (0xff < sVar4))));
    auVar50._0_2_ = auVar41._0_2_ + sVar25;
    auVar50._2_2_ = auVar41._2_2_ + sVar28;
    auVar50._4_2_ = auVar41._4_2_ + sVar29;
    auVar50._6_2_ = auVar41._6_2_ + sVar30;
    auVar50._8_2_ = auVar41._8_2_ + sVar31;
    auVar50._10_2_ = auVar41._10_2_ + sVar32;
    auVar50._12_2_ = auVar41._12_2_ + sVar33;
    auVar50._14_2_ = auVar41._14_2_ + sVar34;
    auVar27 = psraw(auVar50,4);
    sVar4 = auVar27._0_2_;
    sVar5 = auVar27._2_2_;
    sVar6 = auVar27._4_2_;
    sVar7 = auVar27._6_2_;
    auVar51._0_4_ =
         CONCAT13((0 < sVar7) * (sVar7 < 0x100) * auVar27[6] - (0xff < sVar7),
                  CONCAT12((0 < sVar6) * (sVar6 < 0x100) * auVar27[4] - (0xff < sVar6),
                           CONCAT11((0 < sVar5) * (sVar5 < 0x100) * auVar27[2] - (0xff < sVar5),
                                    (0 < sVar4) * (sVar4 < 0x100) * auVar27[0] - (0xff < sVar4))));
    sVar8 = auVar27._8_2_;
    auVar51[4] = (0 < sVar8) * (sVar8 < 0x100) * auVar27[8] - (0xff < sVar8);
    sVar9 = auVar27._10_2_;
    auVar51[5] = (0 < sVar9) * (sVar9 < 0x100) * auVar27[10] - (0xff < sVar9);
    sVar10 = auVar27._12_2_;
    auVar51[6] = (0 < sVar10) * (sVar10 < 0x100) * auVar27[0xc] - (0xff < sVar10);
    sVar11 = auVar27._14_2_;
    auVar51[7] = (0 < sVar11) * (sVar11 < 0x100) * auVar27[0xe] - (0xff < sVar11);
    auVar51[8] = (0 < sVar4) * (sVar4 < 0x100) * auVar27[0] - (0xff < sVar4);
    auVar51[9] = (0 < sVar5) * (sVar5 < 0x100) * auVar27[2] - (0xff < sVar5);
    auVar51[10] = (0 < sVar6) * (sVar6 < 0x100) * auVar27[4] - (0xff < sVar6);
    auVar51[0xb] = (0 < sVar7) * (sVar7 < 0x100) * auVar27[6] - (0xff < sVar7);
    auVar51[0xc] = (0 < sVar8) * (sVar8 < 0x100) * auVar27[8] - (0xff < sVar8);
    auVar51[0xd] = (0 < sVar9) * (sVar9 < 0x100) * auVar27[10] - (0xff < sVar9);
    auVar51[0xe] = (0 < sVar10) * (sVar10 < 0x100) * auVar27[0xc] - (0xff < sVar10);
    auVar51[0xf] = (0 < sVar11) * (sVar11 < 0x100) * auVar27[0xe] - (0xff < sVar11);
    *(undefined4 *)(dst + stride) = auVar51._0_4_;
    auVar41 = pshufb(auVar51,_DAT_00560490);
    auVar27 = pshufb(ZEXT416(auVar81._0_4_) << 0x40,_DAT_005604f0);
    auVar27 = auVar27 | auVar41;
    auVar41 = pmaddubsw(auVar27,auVar24);
    auVar49 = pmaddubsw(auVar27,auVar39);
    auVar41 = phaddw(auVar41,auVar49);
    auVar41 = phaddw(auVar41,auVar41);
    auVar43._0_2_ = auVar41._0_2_ + sVar25;
    auVar43._2_2_ = auVar41._2_2_ + sVar28;
    auVar43._4_2_ = auVar41._4_2_ + sVar29;
    auVar43._6_2_ = auVar41._6_2_ + sVar30;
    auVar43._8_2_ = auVar41._8_2_ + sVar31;
    auVar43._10_2_ = auVar41._10_2_ + sVar32;
    auVar43._12_2_ = auVar41._12_2_ + sVar33;
    auVar43._14_2_ = auVar41._14_2_ + sVar34;
    auVar41 = psraw(auVar43,4);
    auVar49 = pmaddubsw(auVar27,auVar26);
    auVar27 = pmaddubsw(auVar27,auVar40);
    auVar27 = phaddw(auVar49,auVar27);
    sVar4 = auVar41._0_2_;
    sVar5 = auVar41._2_2_;
    sVar6 = auVar41._4_2_;
    sVar7 = auVar41._6_2_;
    auVar27 = phaddw(auVar27,auVar27);
    *(uint *)(dst + stride * 2) =
         CONCAT13((0 < sVar7) * (sVar7 < 0x100) * auVar41[6] - (0xff < sVar7),
                  CONCAT12((0 < sVar6) * (sVar6 < 0x100) * auVar41[4] - (0xff < sVar6),
                           CONCAT11((0 < sVar5) * (sVar5 < 0x100) * auVar41[2] - (0xff < sVar5),
                                    (0 < sVar4) * (sVar4 < 0x100) * auVar41[0] - (0xff < sVar4))));
    auVar52._0_2_ = auVar27._0_2_ + sVar25;
    auVar52._2_2_ = auVar27._2_2_ + sVar28;
    auVar52._4_2_ = auVar27._4_2_ + sVar29;
    auVar52._6_2_ = auVar27._6_2_ + sVar30;
    auVar52._8_2_ = auVar27._8_2_ + sVar31;
    auVar52._10_2_ = auVar27._10_2_ + sVar32;
    auVar52._12_2_ = auVar27._12_2_ + sVar33;
    auVar52._14_2_ = auVar27._14_2_ + sVar34;
    auVar27 = psraw(auVar52,4);
    sVar4 = auVar27._0_2_;
    sVar5 = auVar27._2_2_;
    sVar6 = auVar27._4_2_;
    sVar7 = auVar27._6_2_;
    *(uint *)(dst + stride * 3) =
         CONCAT13((0 < sVar7) * (sVar7 < 0x100) * auVar27[6] - (0xff < sVar7),
                  CONCAT12((0 < sVar6) * (sVar6 < 0x100) * auVar27[4] - (0xff < sVar6),
                           CONCAT11((0 < sVar5) * (sVar5 < 0x100) * auVar27[2] - (0xff < sVar5),
                                    (0 < sVar4) * (sVar4 < 0x100) * auVar27[0] - (0xff < sVar4))));
    if ((0x7dfdeUL >> ((ulong)tx_size & 0x3f) & 1) != 0) {
      uVar23 = 3;
      do {
        auVar41._8_8_ = uVar23;
        uVar13 = CONCAT16(dst[auVar41._8_8_ + stride],
                          CONCAT15(dst[auVar41._8_8_],
                                   CONCAT14(above[auVar41._8_8_ + 4],
                                            *(undefined4 *)(above + auVar41._8_8_))));
        auVar35[7] = 0;
        auVar35._0_7_ = uVar13;
        auVar35._8_4_ = *(undefined4 *)(above + auVar41._8_8_);
        auVar35._12_3_ = (int3)(uVar13 >> 0x20);
        auVar35[0xf] = 0;
        auVar27 = pmaddubsw(auVar35,auVar24);
        auVar49 = pmaddubsw(auVar35,auVar39);
        auVar27 = phaddw(auVar27,auVar49);
        auVar27 = phaddw(auVar27,auVar27);
        auVar44._0_2_ = auVar27._0_2_ + sVar25;
        auVar44._2_2_ = auVar27._2_2_ + sVar28;
        auVar44._4_2_ = auVar27._4_2_ + sVar29;
        auVar44._6_2_ = auVar27._6_2_ + sVar30;
        auVar44._8_2_ = auVar27._8_2_ + sVar31;
        auVar44._10_2_ = auVar27._10_2_ + sVar32;
        auVar44._12_2_ = auVar27._12_2_ + sVar33;
        auVar44._14_2_ = auVar27._14_2_ + sVar34;
        auVar27 = psraw(auVar44,4);
        sVar4 = auVar27._0_2_;
        sVar5 = auVar27._2_2_;
        sVar6 = auVar27._4_2_;
        sVar7 = auVar27._6_2_;
        *(uint *)(dst + auVar41._8_8_ + 1) =
             CONCAT13((0 < sVar7) * (sVar7 < 0x100) * auVar27[6] - (0xff < sVar7),
                      CONCAT12((0 < sVar6) * (sVar6 < 0x100) * auVar27[4] - (0xff < sVar6),
                               CONCAT11((0 < sVar5) * (sVar5 < 0x100) * auVar27[2] - (0xff < sVar5),
                                        (0 < sVar4) * (sVar4 < 0x100) * auVar27[0] - (0xff < sVar4))
                              ));
        auVar49 = pmaddubsw(auVar35,auVar26);
        auVar27 = pmaddubsw(auVar35,auVar40);
        auVar27 = phaddw(auVar49,auVar27);
        auVar27 = phaddw(auVar27,auVar27);
        auVar45._0_2_ = auVar27._0_2_ + sVar25;
        auVar45._2_2_ = auVar27._2_2_ + sVar28;
        auVar45._4_2_ = auVar27._4_2_ + sVar29;
        auVar45._6_2_ = auVar27._6_2_ + sVar30;
        auVar45._8_2_ = auVar27._8_2_ + sVar31;
        auVar45._10_2_ = auVar27._10_2_ + sVar32;
        auVar45._12_2_ = auVar27._12_2_ + sVar33;
        auVar45._14_2_ = auVar27._14_2_ + sVar34;
        auVar27 = psraw(auVar45,4);
        sVar4 = auVar27._0_2_;
        sVar5 = auVar27._2_2_;
        sVar6 = auVar27._4_2_;
        sVar7 = auVar27._6_2_;
        cVar3 = (0 < sVar7) * (sVar7 < 0x100) * auVar27[6] - (0xff < sVar7);
        *(uint *)(dst + auVar41._8_8_ + stride + 1) =
             CONCAT13(cVar3,CONCAT12((0 < sVar6) * (sVar6 < 0x100) * auVar27[4] - (0xff < sVar6),
                                     CONCAT11((0 < sVar5) * (sVar5 < 0x100) * auVar27[2] -
                                              (0xff < sVar5),
                                              (0 < sVar4) * (sVar4 < 0x100) * auVar27[0] -
                                              (0xff < sVar4))));
        uVar13 = CONCAT16(dst[auVar41._8_8_ + stride * 3],
                          CONCAT15(dst[auVar41._8_8_ + stride * 2],
                                   CONCAT14(cVar3,*(undefined4 *)(dst + auVar41._8_8_ + stride))));
        auVar36[7] = 0;
        auVar36._0_7_ = uVar13;
        auVar36._8_4_ = *(undefined4 *)(dst + auVar41._8_8_ + stride);
        auVar36._12_3_ = (int3)(uVar13 >> 0x20);
        auVar36[0xf] = 0;
        auVar27 = pmaddubsw(auVar36,auVar24);
        auVar49 = pmaddubsw(auVar36,auVar39);
        auVar27 = phaddw(auVar27,auVar49);
        auVar27 = phaddw(auVar27,auVar27);
        auVar46._0_2_ = auVar27._0_2_ + sVar25;
        auVar46._2_2_ = auVar27._2_2_ + sVar28;
        auVar46._4_2_ = auVar27._4_2_ + sVar29;
        auVar46._6_2_ = auVar27._6_2_ + sVar30;
        auVar46._8_2_ = auVar27._8_2_ + sVar31;
        auVar46._10_2_ = auVar27._10_2_ + sVar32;
        auVar46._12_2_ = auVar27._12_2_ + sVar33;
        auVar46._14_2_ = auVar27._14_2_ + sVar34;
        auVar49 = pmaddubsw(auVar36,auVar26);
        auVar27 = pmaddubsw(auVar36,auVar40);
        auVar49 = phaddw(auVar49,auVar27);
        auVar27 = psraw(auVar46,4);
        auVar49 = phaddw(auVar49,auVar49);
        sVar4 = auVar27._0_2_;
        sVar5 = auVar27._2_2_;
        sVar6 = auVar27._4_2_;
        sVar7 = auVar27._6_2_;
        *(uint *)(dst + auVar41._8_8_ + stride * 2 + 1) =
             CONCAT13((0 < sVar7) * (sVar7 < 0x100) * auVar27[6] - (0xff < sVar7),
                      CONCAT12((0 < sVar6) * (sVar6 < 0x100) * auVar27[4] - (0xff < sVar6),
                               CONCAT11((0 < sVar5) * (sVar5 < 0x100) * auVar27[2] - (0xff < sVar5),
                                        (0 < sVar4) * (sVar4 < 0x100) * auVar27[0] - (0xff < sVar4))
                              ));
        auVar53._0_2_ = auVar49._0_2_ + sVar25;
        auVar53._2_2_ = auVar49._2_2_ + sVar28;
        auVar53._4_2_ = auVar49._4_2_ + sVar29;
        auVar53._6_2_ = auVar49._6_2_ + sVar30;
        auVar53._8_2_ = auVar49._8_2_ + sVar31;
        auVar53._10_2_ = auVar49._10_2_ + sVar32;
        auVar53._12_2_ = auVar49._12_2_ + sVar33;
        auVar53._14_2_ = auVar49._14_2_ + sVar34;
        auVar27 = psraw(auVar53,4);
        sVar4 = auVar27._0_2_;
        sVar5 = auVar27._2_2_;
        sVar6 = auVar27._4_2_;
        sVar7 = auVar27._6_2_;
        *(uint *)(dst + auVar41._8_8_ + stride * 3 + 1) =
             CONCAT13((0 < sVar7) * (sVar7 < 0x100) * auVar27[6] - (0xff < sVar7),
                      CONCAT12((0 < sVar6) * (sVar6 < 0x100) * auVar27[4] - (0xff < sVar6),
                               CONCAT11((0 < sVar5) * (sVar5 < 0x100) * auVar27[2] - (0xff < sVar5),
                                        (0 < sVar4) * (sVar4 < 0x100) * auVar27[0] - (0xff < sVar4))
                              ));
        uVar23 = auVar41._8_8_ + 4;
      } while (auVar41._8_8_ + 4 < (ulong)(iVar1 - 4));
      dst = dst + auVar41._8_8_ + 1;
    }
    auVar49 = _DAT_00560510;
    auVar41 = _DAT_00560500;
    auVar27 = _DAT_00560490;
    if ((0x7bfbeUL >> ((ulong)tx_size & 0x3f) & 1) != 0) {
      lVar19 = stride * 4 - lVar18;
      lVar20 = stride * 7 - lVar18;
      lVar21 = stride * 6 - lVar18;
      lVar22 = stride * 5 - lVar18;
      lVar14 = stride * 3 - lVar18;
      uVar23 = 4;
      do {
        puVar15 = dst + (stride * 4 - lVar18) + 4;
        auVar81 = pshufb(ZEXT416(*(uint *)(left + (uVar23 - 1))) << 0x40 |
                         ZEXT416(*(uint *)(puVar15 + -stride)),auVar41);
        auVar66 = pmaddubsw(auVar81,auVar24);
        auVar85 = pmaddubsw(auVar81,auVar39);
        auVar66 = phaddw(auVar66,auVar85);
        auVar85 = phaddw(auVar66,auVar66);
        auVar66 = pshufb(ZEXT516(CONCAT14(left[uVar23 + 3],*(uint *)(left + (uVar23 - 1)))) << 0x40,
                         auVar49);
        auVar67._0_2_ = auVar85._0_2_ + sVar25;
        auVar67._2_2_ = auVar85._2_2_ + sVar28;
        auVar67._4_2_ = auVar85._4_2_ + sVar29;
        auVar67._6_2_ = auVar85._6_2_ + sVar30;
        auVar67._8_2_ = auVar85._8_2_ + sVar31;
        auVar67._10_2_ = auVar85._10_2_ + sVar32;
        auVar67._12_2_ = auVar85._12_2_ + sVar33;
        auVar67._14_2_ = auVar85._14_2_ + sVar34;
        auVar85 = psraw(auVar67,4);
        sVar4 = auVar85._0_2_;
        sVar5 = auVar85._2_2_;
        sVar6 = auVar85._4_2_;
        sVar7 = auVar85._6_2_;
        *(uint *)(dst + stride * 4 + (4 - lVar18)) =
             CONCAT13((0 < sVar7) * (sVar7 < 0x100) * auVar85[6] - (0xff < sVar7),
                      CONCAT12((0 < sVar6) * (sVar6 < 0x100) * auVar85[4] - (0xff < sVar6),
                               CONCAT11((0 < sVar5) * (sVar5 < 0x100) * auVar85[2] - (0xff < sVar5),
                                        (0 < sVar4) * (sVar4 < 0x100) * auVar85[0] - (0xff < sVar4))
                              ));
        auVar85 = pmaddubsw(auVar81,auVar26);
        auVar81 = pmaddubsw(auVar81,auVar40);
        auVar85 = phaddw(auVar85,auVar81);
        auVar85 = phaddw(auVar85,auVar85);
        auVar68._0_2_ = auVar85._0_2_ + sVar25;
        auVar68._2_2_ = auVar85._2_2_ + sVar28;
        auVar68._4_2_ = auVar85._4_2_ + sVar29;
        auVar68._6_2_ = auVar85._6_2_ + sVar30;
        auVar68._8_2_ = auVar85._8_2_ + sVar31;
        auVar68._10_2_ = auVar85._10_2_ + sVar32;
        auVar68._12_2_ = auVar85._12_2_ + sVar33;
        auVar68._14_2_ = auVar85._14_2_ + sVar34;
        auVar85 = psraw(auVar68,4);
        sVar4 = auVar85._0_2_;
        sVar5 = auVar85._2_2_;
        sVar6 = auVar85._4_2_;
        sVar7 = auVar85._6_2_;
        auVar69._0_4_ =
             CONCAT13((0 < sVar7) * (sVar7 < 0x100) * auVar85[6] - (0xff < sVar7),
                      CONCAT12((0 < sVar6) * (sVar6 < 0x100) * auVar85[4] - (0xff < sVar6),
                               CONCAT11((0 < sVar5) * (sVar5 < 0x100) * auVar85[2] - (0xff < sVar5),
                                        (0 < sVar4) * (sVar4 < 0x100) * auVar85[0] - (0xff < sVar4))
                              ));
        sVar8 = auVar85._8_2_;
        auVar69[4] = (0 < sVar8) * (sVar8 < 0x100) * auVar85[8] - (0xff < sVar8);
        sVar9 = auVar85._10_2_;
        auVar69[5] = (0 < sVar9) * (sVar9 < 0x100) * auVar85[10] - (0xff < sVar9);
        sVar10 = auVar85._12_2_;
        auVar69[6] = (0 < sVar10) * (sVar10 < 0x100) * auVar85[0xc] - (0xff < sVar10);
        sVar11 = auVar85._14_2_;
        auVar69[7] = (0 < sVar11) * (sVar11 < 0x100) * auVar85[0xe] - (0xff < sVar11);
        auVar69[8] = (0 < sVar4) * (sVar4 < 0x100) * auVar85[0] - (0xff < sVar4);
        auVar69[9] = (0 < sVar5) * (sVar5 < 0x100) * auVar85[2] - (0xff < sVar5);
        auVar69[10] = (0 < sVar6) * (sVar6 < 0x100) * auVar85[4] - (0xff < sVar6);
        auVar69[0xb] = (0 < sVar7) * (sVar7 < 0x100) * auVar85[6] - (0xff < sVar7);
        auVar69[0xc] = (0 < sVar8) * (sVar8 < 0x100) * auVar85[8] - (0xff < sVar8);
        auVar69[0xd] = (0 < sVar9) * (sVar9 < 0x100) * auVar85[10] - (0xff < sVar9);
        auVar69[0xe] = (0 < sVar10) * (sVar10 < 0x100) * auVar85[0xc] - (0xff < sVar10);
        auVar69[0xf] = (0 < sVar11) * (sVar11 < 0x100) * auVar85[0xe] - (0xff < sVar11);
        *(undefined4 *)(puVar15 + stride) = auVar69._0_4_;
        auVar85 = pshufb(auVar69,auVar27);
        auVar85 = auVar85 | auVar66;
        auVar66 = pmaddubsw(auVar85,auVar24);
        auVar81 = pmaddubsw(auVar85,auVar39);
        auVar66 = phaddw(auVar66,auVar81);
        auVar66 = phaddw(auVar66,auVar66);
        auVar57._0_2_ = auVar66._0_2_ + sVar25;
        auVar57._2_2_ = auVar66._2_2_ + sVar28;
        auVar57._4_2_ = auVar66._4_2_ + sVar29;
        auVar57._6_2_ = auVar66._6_2_ + sVar30;
        auVar57._8_2_ = auVar66._8_2_ + sVar31;
        auVar57._10_2_ = auVar66._10_2_ + sVar32;
        auVar57._12_2_ = auVar66._12_2_ + sVar33;
        auVar57._14_2_ = auVar66._14_2_ + sVar34;
        auVar66 = psraw(auVar57,4);
        sVar4 = auVar66._0_2_;
        sVar5 = auVar66._2_2_;
        sVar6 = auVar66._4_2_;
        sVar7 = auVar66._6_2_;
        *(uint *)(puVar15 + stride * 2) =
             CONCAT13((0 < sVar7) * (sVar7 < 0x100) * auVar66[6] - (0xff < sVar7),
                      CONCAT12((0 < sVar6) * (sVar6 < 0x100) * auVar66[4] - (0xff < sVar6),
                               CONCAT11((0 < sVar5) * (sVar5 < 0x100) * auVar66[2] - (0xff < sVar5),
                                        (0 < sVar4) * (sVar4 < 0x100) * auVar66[0] - (0xff < sVar4))
                              ));
        auVar66 = pmaddubsw(auVar85,auVar26);
        auVar85 = pmaddubsw(auVar85,auVar40);
        auVar66 = phaddw(auVar66,auVar85);
        auVar66 = phaddw(auVar66,auVar66);
        auVar58._0_2_ = auVar66._0_2_ + sVar25;
        auVar58._2_2_ = auVar66._2_2_ + sVar28;
        auVar58._4_2_ = auVar66._4_2_ + sVar29;
        auVar58._6_2_ = auVar66._6_2_ + sVar30;
        auVar58._8_2_ = auVar66._8_2_ + sVar31;
        auVar58._10_2_ = auVar66._10_2_ + sVar32;
        auVar58._12_2_ = auVar66._12_2_ + sVar33;
        auVar58._14_2_ = auVar66._14_2_ + sVar34;
        auVar66 = psraw(auVar58,4);
        sVar4 = auVar66._0_2_;
        sVar5 = auVar66._2_2_;
        sVar6 = auVar66._4_2_;
        sVar7 = auVar66._6_2_;
        *(uint *)(puVar15 + stride * 3) =
             CONCAT13((0 < sVar7) * (sVar7 < 0x100) * auVar66[6] - (0xff < sVar7),
                      CONCAT12((0 < sVar6) * (sVar6 < 0x100) * auVar66[4] - (0xff < sVar6),
                               CONCAT11((0 < sVar5) * (sVar5 < 0x100) * auVar66[2] - (0xff < sVar5),
                                        (0 < sVar4) * (sVar4 < 0x100) * auVar66[0] - (0xff < sVar4))
                              ));
        if ((0x7dfdeUL >> (tx_size & 0x3f) & 1) != 0) {
          lVar16 = 0;
          do {
            uVar13 = CONCAT16(dst[lVar16 + lVar22 + 7],
                              CONCAT15(dst[lVar16 + lVar19 + 7],
                                       CONCAT14(dst[lVar16 + lVar14 + 0xb],
                                                *(undefined4 *)(dst + lVar16 + lVar14 + 7))));
            auVar59[7] = 0;
            auVar59._0_7_ = uVar13;
            auVar59._8_4_ = *(undefined4 *)(dst + lVar16 + lVar14 + 7);
            auVar59._12_3_ = (int3)(uVar13 >> 0x20);
            auVar59[0xf] = 0;
            auVar66 = pmaddubsw(auVar59,auVar24);
            auVar85 = pmaddubsw(auVar59,auVar39);
            auVar66 = phaddw(auVar66,auVar85);
            auVar66 = phaddw(auVar66,auVar66);
            auVar70._0_2_ = auVar66._0_2_ + sVar25;
            auVar70._2_2_ = auVar66._2_2_ + sVar28;
            auVar70._4_2_ = auVar66._4_2_ + sVar29;
            auVar70._6_2_ = auVar66._6_2_ + sVar30;
            auVar70._8_2_ = auVar66._8_2_ + sVar31;
            auVar70._10_2_ = auVar66._10_2_ + sVar32;
            auVar70._12_2_ = auVar66._12_2_ + sVar33;
            auVar70._14_2_ = auVar66._14_2_ + sVar34;
            auVar66 = psraw(auVar70,4);
            sVar4 = auVar66._0_2_;
            sVar5 = auVar66._2_2_;
            sVar6 = auVar66._4_2_;
            sVar7 = auVar66._6_2_;
            *(uint *)(dst + lVar16 + lVar19 + 8) =
                 CONCAT13((0 < sVar7) * (sVar7 < 0x100) * auVar66[6] - (0xff < sVar7),
                          CONCAT12((0 < sVar6) * (sVar6 < 0x100) * auVar66[4] - (0xff < sVar6),
                                   CONCAT11((0 < sVar5) * (sVar5 < 0x100) * auVar66[2] -
                                            (0xff < sVar5),
                                            (0 < sVar4) * (sVar4 < 0x100) * auVar66[0] -
                                            (0xff < sVar4))));
            auVar85 = pmaddubsw(auVar59,auVar26);
            auVar66 = pmaddubsw(auVar59,auVar40);
            auVar66 = phaddw(auVar85,auVar66);
            auVar66 = phaddw(auVar66,auVar66);
            auVar71._0_2_ = auVar66._0_2_ + sVar25;
            auVar71._2_2_ = auVar66._2_2_ + sVar28;
            auVar71._4_2_ = auVar66._4_2_ + sVar29;
            auVar71._6_2_ = auVar66._6_2_ + sVar30;
            auVar71._8_2_ = auVar66._8_2_ + sVar31;
            auVar71._10_2_ = auVar66._10_2_ + sVar32;
            auVar71._12_2_ = auVar66._12_2_ + sVar33;
            auVar71._14_2_ = auVar66._14_2_ + sVar34;
            auVar66 = psraw(auVar71,4);
            sVar4 = auVar66._0_2_;
            sVar5 = auVar66._2_2_;
            sVar6 = auVar66._4_2_;
            sVar7 = auVar66._6_2_;
            cVar3 = (0 < sVar7) * (sVar7 < 0x100) * auVar66[6] - (0xff < sVar7);
            *(uint *)(dst + lVar16 + lVar22 + 8) =
                 CONCAT13(cVar3,CONCAT12((0 < sVar6) * (sVar6 < 0x100) * auVar66[4] - (0xff < sVar6)
                                         ,CONCAT11((0 < sVar5) * (sVar5 < 0x100) * auVar66[2] -
                                                   (0xff < sVar5),
                                                   (0 < sVar4) * (sVar4 < 0x100) * auVar66[0] -
                                                   (0xff < sVar4))));
            uVar13 = CONCAT16(dst[lVar16 + lVar20 + 7],
                              CONCAT15(dst[lVar16 + lVar21 + 7],
                                       CONCAT14(cVar3,*(undefined4 *)(dst + lVar16 + lVar22 + 7))));
            auVar60[7] = 0;
            auVar60._0_7_ = uVar13;
            auVar60._8_4_ = *(undefined4 *)(dst + lVar16 + lVar22 + 7);
            auVar60._12_3_ = (int3)(uVar13 >> 0x20);
            auVar60[0xf] = 0;
            auVar66 = pmaddubsw(auVar60,auVar24);
            auVar85 = pmaddubsw(auVar60,auVar39);
            auVar66 = phaddw(auVar66,auVar85);
            auVar66 = phaddw(auVar66,auVar66);
            auVar72._0_2_ = auVar66._0_2_ + sVar25;
            auVar72._2_2_ = auVar66._2_2_ + sVar28;
            auVar72._4_2_ = auVar66._4_2_ + sVar29;
            auVar72._6_2_ = auVar66._6_2_ + sVar30;
            auVar72._8_2_ = auVar66._8_2_ + sVar31;
            auVar72._10_2_ = auVar66._10_2_ + sVar32;
            auVar72._12_2_ = auVar66._12_2_ + sVar33;
            auVar72._14_2_ = auVar66._14_2_ + sVar34;
            auVar85 = psraw(auVar72,4);
            auVar81 = pmaddubsw(auVar60,auVar26);
            auVar66 = pmaddubsw(auVar60,auVar40);
            auVar66 = phaddw(auVar81,auVar66);
            sVar4 = auVar85._0_2_;
            sVar5 = auVar85._2_2_;
            sVar6 = auVar85._4_2_;
            sVar7 = auVar85._6_2_;
            auVar66 = phaddw(auVar66,auVar66);
            *(uint *)(dst + lVar16 + lVar21 + 8) =
                 CONCAT13((0 < sVar7) * (sVar7 < 0x100) * auVar85[6] - (0xff < sVar7),
                          CONCAT12((0 < sVar6) * (sVar6 < 0x100) * auVar85[4] - (0xff < sVar6),
                                   CONCAT11((0 < sVar5) * (sVar5 < 0x100) * auVar85[2] -
                                            (0xff < sVar5),
                                            (0 < sVar4) * (sVar4 < 0x100) * auVar85[0] -
                                            (0xff < sVar4))));
            auVar82._0_2_ = auVar66._0_2_ + sVar25;
            auVar82._2_2_ = auVar66._2_2_ + sVar28;
            auVar82._4_2_ = auVar66._4_2_ + sVar29;
            auVar82._6_2_ = auVar66._6_2_ + sVar30;
            auVar82._8_2_ = auVar66._8_2_ + sVar31;
            auVar82._10_2_ = auVar66._10_2_ + sVar32;
            auVar82._12_2_ = auVar66._12_2_ + sVar33;
            auVar82._14_2_ = auVar66._14_2_ + sVar34;
            auVar66 = psraw(auVar82,4);
            sVar4 = auVar66._0_2_;
            sVar5 = auVar66._2_2_;
            sVar6 = auVar66._4_2_;
            sVar7 = auVar66._6_2_;
            *(uint *)(dst + lVar16 + lVar20 + 8) =
                 CONCAT13((0 < sVar7) * (sVar7 < 0x100) * auVar66[6] - (0xff < sVar7),
                          CONCAT12((0 < sVar6) * (sVar6 < 0x100) * auVar66[4] - (0xff < sVar6),
                                   CONCAT11((0 < sVar5) * (sVar5 < 0x100) * auVar66[2] -
                                            (0xff < sVar5),
                                            (0 < sVar4) * (sVar4 < 0x100) * auVar66[0] -
                                            (0xff < sVar4))));
            lVar17 = lVar16 + 4;
            iVar12 = (int)lVar16;
            lVar16 = lVar17;
          } while (iVar12 + 8 < iVar1);
          puVar15 = dst + lVar17 + lVar19 + 4;
        }
        uVar23 = uVar23 + 4;
        dst = puVar15;
      } while (uVar23 < uVar2);
    }
  }
  else {
    auVar24 = *(undefined1 (*) [16])av1_filter_intra_taps[mode];
    auVar39 = *(undefined1 (*) [16])(av1_filter_intra_taps[mode] + 2);
    auVar26 = *(undefined1 (*) [16])(av1_filter_intra_taps[mode] + 4);
    auVar40 = *(undefined1 (*) [16])(av1_filter_intra_taps[mode] + 6);
    if ((0x4041UL >> ((ulong)tx_size & 0x3f) & 1) == 0) {
      auVar27._8_8_ = 0;
      auVar27._0_8_ = *(ulong *)left;
    }
    else {
      auVar27 = ZEXT416(*(uint *)left);
    }
    uVar23 = auVar27._0_8_;
    auVar41._0_8_ = uVar23 << 0x28;
    auVar41._8_8_ = auVar27._8_8_ << 0x28 | uVar23 >> 0x18;
    auVar27 = ZEXT516(*(uint5 *)(above + -1)) | auVar41;
    auVar49._0_8_ = auVar27._0_8_;
    auVar49._8_4_ = auVar27._0_4_;
    auVar49._12_4_ = auVar27._4_4_;
    auVar66 = pmaddubsw(auVar49,auVar24);
    auVar27 = pmaddubsw(auVar49,auVar39);
    auVar66 = phaddw(auVar66,auVar27);
    auVar66 = phaddw(auVar66,auVar66);
    auVar27 = pmovsxbw(auVar27,0x808080808080808);
    sVar25 = auVar27._0_2_;
    auVar85._0_2_ = auVar66._0_2_ + sVar25;
    sVar28 = auVar27._2_2_;
    auVar85._2_2_ = auVar66._2_2_ + sVar28;
    sVar29 = auVar27._4_2_;
    auVar85._4_2_ = auVar66._4_2_ + sVar29;
    sVar30 = auVar27._6_2_;
    auVar85._6_2_ = auVar66._6_2_ + sVar30;
    sVar31 = auVar27._8_2_;
    auVar85._8_2_ = auVar66._8_2_ + sVar31;
    sVar32 = auVar27._10_2_;
    auVar85._10_2_ = auVar66._10_2_ + sVar32;
    sVar33 = auVar27._12_2_;
    auVar85._12_2_ = auVar66._12_2_ + sVar33;
    sVar34 = auVar27._14_2_;
    auVar85._14_2_ = auVar66._14_2_ + sVar34;
    auVar66 = pmaddubsw(auVar49,auVar26);
    auVar27 = pmaddubsw(auVar49,auVar40);
    auVar49 = phaddw(auVar66,auVar27);
    auVar27 = psraw(auVar85,4);
    auVar49 = phaddw(auVar49,auVar49);
    sVar4 = auVar27._0_2_;
    sVar5 = auVar27._2_2_;
    sVar6 = auVar27._4_2_;
    sVar7 = auVar27._6_2_;
    *(uint *)dst = CONCAT13((0 < sVar7) * (sVar7 < 0x100) * auVar27[6] - (0xff < sVar7),
                            CONCAT12((0 < sVar6) * (sVar6 < 0x100) * auVar27[4] - (0xff < sVar6),
                                     CONCAT11((0 < sVar5) * (sVar5 < 0x100) * auVar27[2] -
                                              (0xff < sVar5),
                                              (0 < sVar4) * (sVar4 < 0x100) * auVar27[0] -
                                              (0xff < sVar4))));
    auVar61._0_2_ = auVar49._0_2_ + sVar25;
    auVar61._2_2_ = auVar49._2_2_ + sVar28;
    auVar61._4_2_ = auVar49._4_2_ + sVar29;
    auVar61._6_2_ = auVar49._6_2_ + sVar30;
    auVar61._8_2_ = auVar49._8_2_ + sVar31;
    auVar61._10_2_ = auVar49._10_2_ + sVar32;
    auVar61._12_2_ = auVar49._12_2_ + sVar33;
    auVar61._14_2_ = auVar49._14_2_ + sVar34;
    auVar27 = psraw(auVar61,4);
    sVar4 = auVar27._0_2_;
    sVar5 = auVar27._2_2_;
    sVar6 = auVar27._4_2_;
    sVar7 = auVar27._6_2_;
    auVar62._0_4_ =
         CONCAT13((0 < sVar7) * (sVar7 < 0x100) * auVar27[6] - (0xff < sVar7),
                  CONCAT12((0 < sVar6) * (sVar6 < 0x100) * auVar27[4] - (0xff < sVar6),
                           CONCAT11((0 < sVar5) * (sVar5 < 0x100) * auVar27[2] - (0xff < sVar5),
                                    (0 < sVar4) * (sVar4 < 0x100) * auVar27[0] - (0xff < sVar4))));
    sVar8 = auVar27._8_2_;
    auVar62[4] = (0 < sVar8) * (sVar8 < 0x100) * auVar27[8] - (0xff < sVar8);
    sVar9 = auVar27._10_2_;
    auVar62[5] = (0 < sVar9) * (sVar9 < 0x100) * auVar27[10] - (0xff < sVar9);
    sVar10 = auVar27._12_2_;
    auVar62[6] = (0 < sVar10) * (sVar10 < 0x100) * auVar27[0xc] - (0xff < sVar10);
    sVar11 = auVar27._14_2_;
    auVar62[7] = (0 < sVar11) * (sVar11 < 0x100) * auVar27[0xe] - (0xff < sVar11);
    auVar62[8] = (0 < sVar4) * (sVar4 < 0x100) * auVar27[0] - (0xff < sVar4);
    auVar62[9] = (0 < sVar5) * (sVar5 < 0x100) * auVar27[2] - (0xff < sVar5);
    auVar62[10] = (0 < sVar6) * (sVar6 < 0x100) * auVar27[4] - (0xff < sVar6);
    auVar62[0xb] = (0 < sVar7) * (sVar7 < 0x100) * auVar27[6] - (0xff < sVar7);
    auVar62[0xc] = (0 < sVar8) * (sVar8 < 0x100) * auVar27[8] - (0xff < sVar8);
    auVar62[0xd] = (0 < sVar9) * (sVar9 < 0x100) * auVar27[10] - (0xff < sVar9);
    auVar62[0xe] = (0 < sVar10) * (sVar10 < 0x100) * auVar27[0xc] - (0xff < sVar10);
    auVar62[0xf] = (0 < sVar11) * (sVar11 < 0x100) * auVar27[0xe] - (0xff < sVar11);
    *(undefined4 *)(dst + stride) = auVar62._0_4_;
    auVar49 = pshufb(auVar62,_DAT_00560490);
    auVar27 = pshufb(auVar41,_DAT_005604a0);
    auVar27 = auVar27 | auVar49;
    auVar66 = pmaddubsw(auVar27,auVar24);
    auVar49 = pmaddubsw(auVar27,auVar39);
    auVar49 = phaddw(auVar66,auVar49);
    auVar49 = phaddw(auVar49,auVar49);
    auVar63._0_2_ = auVar49._0_2_ + sVar25;
    auVar63._2_2_ = auVar49._2_2_ + sVar28;
    auVar63._4_2_ = auVar49._4_2_ + sVar29;
    auVar63._6_2_ = auVar49._6_2_ + sVar30;
    auVar63._8_2_ = auVar49._8_2_ + sVar31;
    auVar63._10_2_ = auVar49._10_2_ + sVar32;
    auVar63._12_2_ = auVar49._12_2_ + sVar33;
    auVar63._14_2_ = auVar49._14_2_ + sVar34;
    auVar66 = psraw(auVar63,4);
    auVar49 = pmaddubsw(auVar27,auVar26);
    auVar27 = pmaddubsw(auVar27,auVar40);
    auVar27 = phaddw(auVar49,auVar27);
    sVar4 = auVar66._0_2_;
    sVar5 = auVar66._2_2_;
    sVar6 = auVar66._4_2_;
    sVar7 = auVar66._6_2_;
    auVar27 = phaddw(auVar27,auVar27);
    *(uint *)(dst + stride * 2) =
         CONCAT13((0 < sVar7) * (sVar7 < 0x100) * auVar66[6] - (0xff < sVar7),
                  CONCAT12((0 < sVar6) * (sVar6 < 0x100) * auVar66[4] - (0xff < sVar6),
                           CONCAT11((0 < sVar5) * (sVar5 < 0x100) * auVar66[2] - (0xff < sVar5),
                                    (0 < sVar4) * (sVar4 < 0x100) * auVar66[0] - (0xff < sVar4))));
    auVar66._0_2_ = auVar27._0_2_ + sVar25;
    auVar66._2_2_ = auVar27._2_2_ + sVar28;
    auVar66._4_2_ = auVar27._4_2_ + sVar29;
    auVar66._6_2_ = auVar27._6_2_ + sVar30;
    auVar66._8_2_ = auVar27._8_2_ + sVar31;
    auVar66._10_2_ = auVar27._10_2_ + sVar32;
    auVar66._12_2_ = auVar27._12_2_ + sVar33;
    auVar66._14_2_ = auVar27._14_2_ + sVar34;
    auVar27 = psraw(auVar66,4);
    sVar4 = auVar27._0_2_;
    sVar5 = auVar27._2_2_;
    sVar6 = auVar27._4_2_;
    sVar7 = auVar27._6_2_;
    auVar81._0_4_ =
         CONCAT13((0 < sVar7) * (sVar7 < 0x100) * auVar27[6] - (0xff < sVar7),
                  CONCAT12((0 < sVar6) * (sVar6 < 0x100) * auVar27[4] - (0xff < sVar6),
                           CONCAT11((0 < sVar5) * (sVar5 < 0x100) * auVar27[2] - (0xff < sVar5),
                                    (0 < sVar4) * (sVar4 < 0x100) * auVar27[0] - (0xff < sVar4))));
    sVar8 = auVar27._8_2_;
    auVar81[4] = (0 < sVar8) * (sVar8 < 0x100) * auVar27[8] - (0xff < sVar8);
    sVar9 = auVar27._10_2_;
    auVar81[5] = (0 < sVar9) * (sVar9 < 0x100) * auVar27[10] - (0xff < sVar9);
    sVar10 = auVar27._12_2_;
    auVar81[6] = (0 < sVar10) * (sVar10 < 0x100) * auVar27[0xc] - (0xff < sVar10);
    sVar11 = auVar27._14_2_;
    auVar81[7] = (0 < sVar11) * (sVar11 < 0x100) * auVar27[0xe] - (0xff < sVar11);
    auVar81[8] = (0 < sVar4) * (sVar4 < 0x100) * auVar27[0] - (0xff < sVar4);
    auVar81[9] = (0 < sVar5) * (sVar5 < 0x100) * auVar27[2] - (0xff < sVar5);
    auVar81[10] = (0 < sVar6) * (sVar6 < 0x100) * auVar27[4] - (0xff < sVar6);
    auVar81[0xb] = (0 < sVar7) * (sVar7 < 0x100) * auVar27[6] - (0xff < sVar7);
    auVar81[0xc] = (0 < sVar8) * (sVar8 < 0x100) * auVar27[8] - (0xff < sVar8);
    auVar81[0xd] = (0 < sVar9) * (sVar9 < 0x100) * auVar27[10] - (0xff < sVar9);
    auVar81[0xe] = (0 < sVar10) * (sVar10 < 0x100) * auVar27[0xc] - (0xff < sVar10);
    auVar81[0xf] = (0 < sVar11) * (sVar11 < 0x100) * auVar27[0xe] - (0xff < sVar11);
    *(uint *)(dst + stride * 3) = auVar81._0_4_;
    auVar27 = _DAT_00560490;
    if ((0x42484UL >> ((ulong)tx_size & 0x3f) & 1) == 0) {
      if ((0x7bfbeUL >> ((ulong)tx_size & 0x3f) & 1) == 0) {
        return;
      }
    }
    else {
      auVar37._0_8_ = uVar23 << 0x30;
      auVar41._8_8_ = auVar41._8_8_ << 8;
      auVar37._8_8_ = auVar41._8_8_ | auVar41._0_8_ >> 0x38;
      auVar49 = pshufb(auVar81,_DAT_00560490);
      auVar66 = pshufb(auVar37,_DAT_005604b0);
      auVar66 = auVar66 | auVar49;
      auVar49 = pmaddubsw(auVar66,auVar24);
      auVar85 = pmaddubsw(auVar66,auVar39);
      auVar49 = phaddw(auVar49,auVar85);
      auVar49 = phaddw(auVar49,auVar49);
      auVar54._0_2_ = auVar49._0_2_ + sVar25;
      auVar54._2_2_ = auVar49._2_2_ + sVar28;
      auVar54._4_2_ = auVar49._4_2_ + sVar29;
      auVar54._6_2_ = auVar49._6_2_ + sVar30;
      auVar54._8_2_ = auVar49._8_2_ + sVar31;
      auVar54._10_2_ = auVar49._10_2_ + sVar32;
      auVar54._12_2_ = auVar49._12_2_ + sVar33;
      auVar54._14_2_ = auVar49._14_2_ + sVar34;
      auVar49 = psraw(auVar54,4);
      sVar4 = auVar49._0_2_;
      sVar5 = auVar49._2_2_;
      sVar6 = auVar49._4_2_;
      sVar7 = auVar49._6_2_;
      auVar85 = pmaddubsw(auVar66,auVar26);
      auVar66 = pmaddubsw(auVar66,auVar40);
      auVar66 = phaddw(auVar85,auVar66);
      *(uint *)(dst + stride * 4) =
           CONCAT13((0 < sVar7) * (sVar7 < 0x100) * auVar49[6] - (0xff < sVar7),
                    CONCAT12((0 < sVar6) * (sVar6 < 0x100) * auVar49[4] - (0xff < sVar6),
                             CONCAT11((0 < sVar5) * (sVar5 < 0x100) * auVar49[2] - (0xff < sVar5),
                                      (0 < sVar4) * (sVar4 < 0x100) * auVar49[0] - (0xff < sVar4))))
      ;
      auVar49 = phaddw(auVar66,auVar66);
      auVar73._0_2_ = auVar49._0_2_ + sVar25;
      auVar73._2_2_ = auVar49._2_2_ + sVar28;
      auVar73._4_2_ = auVar49._4_2_ + sVar29;
      auVar73._6_2_ = auVar49._6_2_ + sVar30;
      auVar73._8_2_ = auVar49._8_2_ + sVar31;
      auVar73._10_2_ = auVar49._10_2_ + sVar32;
      auVar73._12_2_ = auVar49._12_2_ + sVar33;
      auVar73._14_2_ = auVar49._14_2_ + sVar34;
      auVar49 = psraw(auVar73,4);
      sVar4 = auVar49._0_2_;
      sVar5 = auVar49._2_2_;
      sVar6 = auVar49._4_2_;
      sVar7 = auVar49._6_2_;
      auVar74._0_4_ =
           CONCAT13((0 < sVar7) * (sVar7 < 0x100) * auVar49[6] - (0xff < sVar7),
                    CONCAT12((0 < sVar6) * (sVar6 < 0x100) * auVar49[4] - (0xff < sVar6),
                             CONCAT11((0 < sVar5) * (sVar5 < 0x100) * auVar49[2] - (0xff < sVar5),
                                      (0 < sVar4) * (sVar4 < 0x100) * auVar49[0] - (0xff < sVar4))))
      ;
      sVar8 = auVar49._8_2_;
      auVar74[4] = (0 < sVar8) * (sVar8 < 0x100) * auVar49[8] - (0xff < sVar8);
      sVar9 = auVar49._10_2_;
      auVar74[5] = (0 < sVar9) * (sVar9 < 0x100) * auVar49[10] - (0xff < sVar9);
      sVar10 = auVar49._12_2_;
      auVar74[6] = (0 < sVar10) * (sVar10 < 0x100) * auVar49[0xc] - (0xff < sVar10);
      sVar11 = auVar49._14_2_;
      auVar74[7] = (0 < sVar11) * (sVar11 < 0x100) * auVar49[0xe] - (0xff < sVar11);
      auVar74[8] = (0 < sVar4) * (sVar4 < 0x100) * auVar49[0] - (0xff < sVar4);
      auVar74[9] = (0 < sVar5) * (sVar5 < 0x100) * auVar49[2] - (0xff < sVar5);
      auVar74[10] = (0 < sVar6) * (sVar6 < 0x100) * auVar49[4] - (0xff < sVar6);
      auVar74[0xb] = (0 < sVar7) * (sVar7 < 0x100) * auVar49[6] - (0xff < sVar7);
      auVar74[0xc] = (0 < sVar8) * (sVar8 < 0x100) * auVar49[8] - (0xff < sVar8);
      auVar74[0xd] = (0 < sVar9) * (sVar9 < 0x100) * auVar49[10] - (0xff < sVar9);
      auVar74[0xe] = (0 < sVar10) * (sVar10 < 0x100) * auVar49[0xc] - (0xff < sVar10);
      auVar74[0xf] = (0 < sVar11) * (sVar11 < 0x100) * auVar49[0xe] - (0xff < sVar11);
      *(undefined4 *)(dst + stride * 5) = auVar74._0_4_;
      uVar23 = *(ulong *)(left + 8);
      auVar66 = pshufb(auVar74,auVar27);
      auVar49 = pshufb(auVar37,_DAT_005604c0);
      auVar49 = auVar49 | auVar66;
      auVar66 = pmaddubsw(auVar49,auVar24);
      auVar85 = pmaddubsw(auVar49,auVar39);
      auVar66 = phaddw(auVar66,auVar85);
      auVar66 = phaddw(auVar66,auVar66);
      auVar75._0_2_ = auVar66._0_2_ + sVar25;
      auVar75._2_2_ = auVar66._2_2_ + sVar28;
      auVar75._4_2_ = auVar66._4_2_ + sVar29;
      auVar75._6_2_ = auVar66._6_2_ + sVar30;
      auVar75._8_2_ = auVar66._8_2_ + sVar31;
      auVar75._10_2_ = auVar66._10_2_ + sVar32;
      auVar75._12_2_ = auVar66._12_2_ + sVar33;
      auVar75._14_2_ = auVar66._14_2_ + sVar34;
      auVar66 = psraw(auVar75,4);
      sVar4 = auVar66._0_2_;
      sVar5 = auVar66._2_2_;
      sVar6 = auVar66._4_2_;
      sVar7 = auVar66._6_2_;
      auVar85 = pmaddubsw(auVar49,auVar26);
      auVar49 = pmaddubsw(auVar49,auVar40);
      auVar49 = phaddw(auVar85,auVar49);
      *(uint *)(dst + stride * 6) =
           CONCAT13((0 < sVar7) * (sVar7 < 0x100) * auVar66[6] - (0xff < sVar7),
                    CONCAT12((0 < sVar6) * (sVar6 < 0x100) * auVar66[4] - (0xff < sVar6),
                             CONCAT11((0 < sVar5) * (sVar5 < 0x100) * auVar66[2] - (0xff < sVar5),
                                      (0 < sVar4) * (sVar4 < 0x100) * auVar66[0] - (0xff < sVar4))))
      ;
      auVar49 = phaddw(auVar49,auVar49);
      auVar83._0_2_ = auVar49._0_2_ + sVar25;
      auVar83._2_2_ = auVar49._2_2_ + sVar28;
      auVar83._4_2_ = auVar49._4_2_ + sVar29;
      auVar83._6_2_ = auVar49._6_2_ + sVar30;
      auVar83._8_2_ = auVar49._8_2_ + sVar31;
      auVar83._10_2_ = auVar49._10_2_ + sVar32;
      auVar83._12_2_ = auVar49._12_2_ + sVar33;
      auVar83._14_2_ = auVar49._14_2_ + sVar34;
      auVar49 = psraw(auVar83,4);
      sVar4 = auVar49._0_2_;
      sVar5 = auVar49._2_2_;
      sVar6 = auVar49._4_2_;
      sVar7 = auVar49._6_2_;
      auVar84._0_4_ =
           CONCAT13((0 < sVar7) * (sVar7 < 0x100) * auVar49[6] - (0xff < sVar7),
                    CONCAT12((0 < sVar6) * (sVar6 < 0x100) * auVar49[4] - (0xff < sVar6),
                             CONCAT11((0 < sVar5) * (sVar5 < 0x100) * auVar49[2] - (0xff < sVar5),
                                      (0 < sVar4) * (sVar4 < 0x100) * auVar49[0] - (0xff < sVar4))))
      ;
      sVar8 = auVar49._8_2_;
      auVar84[4] = (0 < sVar8) * (sVar8 < 0x100) * auVar49[8] - (0xff < sVar8);
      sVar9 = auVar49._10_2_;
      auVar84[5] = (0 < sVar9) * (sVar9 < 0x100) * auVar49[10] - (0xff < sVar9);
      sVar10 = auVar49._12_2_;
      auVar84[6] = (0 < sVar10) * (sVar10 < 0x100) * auVar49[0xc] - (0xff < sVar10);
      sVar11 = auVar49._14_2_;
      auVar84[7] = (0 < sVar11) * (sVar11 < 0x100) * auVar49[0xe] - (0xff < sVar11);
      auVar84[8] = (0 < sVar4) * (sVar4 < 0x100) * auVar49[0] - (0xff < sVar4);
      auVar84[9] = (0 < sVar5) * (sVar5 < 0x100) * auVar49[2] - (0xff < sVar5);
      auVar84[10] = (0 < sVar6) * (sVar6 < 0x100) * auVar49[4] - (0xff < sVar6);
      auVar84[0xb] = (0 < sVar7) * (sVar7 < 0x100) * auVar49[6] - (0xff < sVar7);
      auVar84[0xc] = (0 < sVar8) * (sVar8 < 0x100) * auVar49[8] - (0xff < sVar8);
      auVar84[0xd] = (0 < sVar9) * (sVar9 < 0x100) * auVar49[10] - (0xff < sVar9);
      auVar84[0xe] = (0 < sVar10) * (sVar10 < 0x100) * auVar49[0xc] - (0xff < sVar10);
      auVar84[0xf] = (0 < sVar11) * (sVar11 < 0x100) * auVar49[0xe] - (0xff < sVar11);
      *(undefined4 *)(dst + stride * 7) = auVar84._0_4_;
      auVar49 = _DAT_005604a0;
      auVar64._0_8_ = (auVar41._8_8_ >> 0x28) << 0x30;
      auVar64._8_8_ = auVar41._8_8_ >> 0x38;
      auVar55._0_8_ = uVar23 << 0x38;
      auVar55._8_8_ = uVar23 >> 8;
      auVar55 = auVar55 | auVar64;
      auVar66 = pshufb(auVar84,auVar27);
      auVar41 = pshufb(auVar55,_DAT_005604a0);
      auVar41 = auVar41 | auVar66;
      auVar66 = pmaddubsw(auVar41,auVar24);
      auVar85 = pmaddubsw(auVar41,auVar39);
      auVar66 = phaddw(auVar66,auVar85);
      auVar66 = phaddw(auVar66,auVar66);
      auVar76._0_2_ = auVar66._0_2_ + sVar25;
      auVar76._2_2_ = auVar66._2_2_ + sVar28;
      auVar76._4_2_ = auVar66._4_2_ + sVar29;
      auVar76._6_2_ = auVar66._6_2_ + sVar30;
      auVar76._8_2_ = auVar66._8_2_ + sVar31;
      auVar76._10_2_ = auVar66._10_2_ + sVar32;
      auVar76._12_2_ = auVar66._12_2_ + sVar33;
      auVar76._14_2_ = auVar66._14_2_ + sVar34;
      auVar66 = psraw(auVar76,4);
      sVar4 = auVar66._0_2_;
      sVar5 = auVar66._2_2_;
      sVar6 = auVar66._4_2_;
      sVar7 = auVar66._6_2_;
      *(uint *)(dst + stride * 8) =
           CONCAT13((0 < sVar7) * (sVar7 < 0x100) * auVar66[6] - (0xff < sVar7),
                    CONCAT12((0 < sVar6) * (sVar6 < 0x100) * auVar66[4] - (0xff < sVar6),
                             CONCAT11((0 < sVar5) * (sVar5 < 0x100) * auVar66[2] - (0xff < sVar5),
                                      (0 < sVar4) * (sVar4 < 0x100) * auVar66[0] - (0xff < sVar4))))
      ;
      dst = dst + stride * 8;
      auVar66 = pmaddubsw(auVar41,auVar26);
      auVar41 = pmaddubsw(auVar41,auVar40);
      auVar41 = phaddw(auVar66,auVar41);
      auVar41 = phaddw(auVar41,auVar41);
      auVar77._0_2_ = auVar41._0_2_ + sVar25;
      auVar77._2_2_ = auVar41._2_2_ + sVar28;
      auVar77._4_2_ = auVar41._4_2_ + sVar29;
      auVar77._6_2_ = auVar41._6_2_ + sVar30;
      auVar77._8_2_ = auVar41._8_2_ + sVar31;
      auVar77._10_2_ = auVar41._10_2_ + sVar32;
      auVar77._12_2_ = auVar41._12_2_ + sVar33;
      auVar77._14_2_ = auVar41._14_2_ + sVar34;
      auVar41 = psraw(auVar77,4);
      sVar4 = auVar41._0_2_;
      sVar5 = auVar41._2_2_;
      sVar6 = auVar41._4_2_;
      sVar7 = auVar41._6_2_;
      auVar78._0_4_ =
           CONCAT13((0 < sVar7) * (sVar7 < 0x100) * auVar41[6] - (0xff < sVar7),
                    CONCAT12((0 < sVar6) * (sVar6 < 0x100) * auVar41[4] - (0xff < sVar6),
                             CONCAT11((0 < sVar5) * (sVar5 < 0x100) * auVar41[2] - (0xff < sVar5),
                                      (0 < sVar4) * (sVar4 < 0x100) * auVar41[0] - (0xff < sVar4))))
      ;
      sVar8 = auVar41._8_2_;
      auVar78[4] = (0 < sVar8) * (sVar8 < 0x100) * auVar41[8] - (0xff < sVar8);
      sVar9 = auVar41._10_2_;
      auVar78[5] = (0 < sVar9) * (sVar9 < 0x100) * auVar41[10] - (0xff < sVar9);
      sVar10 = auVar41._12_2_;
      auVar78[6] = (0 < sVar10) * (sVar10 < 0x100) * auVar41[0xc] - (0xff < sVar10);
      sVar11 = auVar41._14_2_;
      auVar78[7] = (0 < sVar11) * (sVar11 < 0x100) * auVar41[0xe] - (0xff < sVar11);
      auVar78[8] = (0 < sVar4) * (sVar4 < 0x100) * auVar41[0] - (0xff < sVar4);
      auVar78[9] = (0 < sVar5) * (sVar5 < 0x100) * auVar41[2] - (0xff < sVar5);
      auVar78[10] = (0 < sVar6) * (sVar6 < 0x100) * auVar41[4] - (0xff < sVar6);
      auVar78[0xb] = (0 < sVar7) * (sVar7 < 0x100) * auVar41[6] - (0xff < sVar7);
      auVar78[0xc] = (0 < sVar8) * (sVar8 < 0x100) * auVar41[8] - (0xff < sVar8);
      auVar78[0xd] = (0 < sVar9) * (sVar9 < 0x100) * auVar41[10] - (0xff < sVar9);
      auVar78[0xe] = (0 < sVar10) * (sVar10 < 0x100) * auVar41[0xc] - (0xff < sVar10);
      auVar78[0xf] = (0 < sVar11) * (sVar11 < 0x100) * auVar41[0xe] - (0xff < sVar11);
      *(undefined4 *)(dst + stride) = auVar78._0_4_;
      auVar41._8_8_ = auVar55._8_8_ >> 0x10;
      auVar27 = pshufb(auVar78,auVar27);
      auVar49 = pshufb(auVar55 >> 0x10,auVar49);
      auVar49 = auVar49 | auVar27;
      auVar27 = pmaddubsw(auVar49,auVar24);
      auVar66 = pmaddubsw(auVar49,auVar39);
      auVar27 = phaddw(auVar27,auVar66);
      auVar27 = phaddw(auVar27,auVar27);
      auVar47._0_2_ = auVar27._0_2_ + sVar25;
      auVar47._2_2_ = auVar27._2_2_ + sVar28;
      auVar47._4_2_ = auVar27._4_2_ + sVar29;
      auVar47._6_2_ = auVar27._6_2_ + sVar30;
      auVar47._8_2_ = auVar27._8_2_ + sVar31;
      auVar47._10_2_ = auVar27._10_2_ + sVar32;
      auVar47._12_2_ = auVar27._12_2_ + sVar33;
      auVar47._14_2_ = auVar27._14_2_ + sVar34;
      auVar27 = psraw(auVar47,4);
      auVar66 = pmaddubsw(auVar49,auVar26);
      auVar49 = pmaddubsw(auVar49,auVar40);
      auVar49 = phaddw(auVar66,auVar49);
      sVar4 = auVar27._0_2_;
      sVar5 = auVar27._2_2_;
      sVar6 = auVar27._4_2_;
      sVar7 = auVar27._6_2_;
      auVar49 = phaddw(auVar49,auVar49);
      *(uint *)(dst + stride * 2) =
           CONCAT13((0 < sVar7) * (sVar7 < 0x100) * auVar27[6] - (0xff < sVar7),
                    CONCAT12((0 < sVar6) * (sVar6 < 0x100) * auVar27[4] - (0xff < sVar6),
                             CONCAT11((0 < sVar5) * (sVar5 < 0x100) * auVar27[2] - (0xff < sVar5),
                                      (0 < sVar4) * (sVar4 < 0x100) * auVar27[0] - (0xff < sVar4))))
      ;
      auVar65._0_2_ = auVar49._0_2_ + sVar25;
      auVar65._2_2_ = auVar49._2_2_ + sVar28;
      auVar65._4_2_ = auVar49._4_2_ + sVar29;
      auVar65._6_2_ = auVar49._6_2_ + sVar30;
      auVar65._8_2_ = auVar49._8_2_ + sVar31;
      auVar65._10_2_ = auVar49._10_2_ + sVar32;
      auVar65._12_2_ = auVar49._12_2_ + sVar33;
      auVar65._14_2_ = auVar49._14_2_ + sVar34;
      auVar27 = psraw(auVar65,4);
      sVar4 = auVar27._0_2_;
      sVar5 = auVar27._2_2_;
      sVar6 = auVar27._4_2_;
      sVar7 = auVar27._6_2_;
      auVar81._0_4_ =
           CONCAT13((0 < sVar7) * (sVar7 < 0x100) * auVar27[6] - (0xff < sVar7),
                    CONCAT12((0 < sVar6) * (sVar6 < 0x100) * auVar27[4] - (0xff < sVar6),
                             CONCAT11((0 < sVar5) * (sVar5 < 0x100) * auVar27[2] - (0xff < sVar5),
                                      (0 < sVar4) * (sVar4 < 0x100) * auVar27[0] - (0xff < sVar4))))
      ;
      *(uint *)(dst + stride * 3) = auVar81._0_4_;
    }
    auVar27 = _DAT_00560490;
    auVar38._0_8_ = auVar41._8_8_ << 0x30;
    auVar38._8_8_ = auVar41._8_8_ >> 0x10;
    auVar41 = pshufb(ZEXT416(auVar81._0_4_),_DAT_00560490);
    auVar49 = pshufb(auVar38,_DAT_005604a0);
    auVar49 = auVar49 | auVar41;
    auVar41 = pmaddubsw(auVar49,auVar24);
    auVar66 = pmaddubsw(auVar49,auVar39);
    auVar41 = phaddw(auVar41,auVar66);
    auVar41 = phaddw(auVar41,auVar41);
    auVar56._0_2_ = auVar41._0_2_ + sVar25;
    auVar56._2_2_ = auVar41._2_2_ + sVar28;
    auVar56._4_2_ = auVar41._4_2_ + sVar29;
    auVar56._6_2_ = auVar41._6_2_ + sVar30;
    auVar56._8_2_ = auVar41._8_2_ + sVar31;
    auVar56._10_2_ = auVar41._10_2_ + sVar32;
    auVar56._12_2_ = auVar41._12_2_ + sVar33;
    auVar56._14_2_ = auVar41._14_2_ + sVar34;
    auVar41 = psraw(auVar56,4);
    sVar4 = auVar41._0_2_;
    sVar5 = auVar41._2_2_;
    sVar6 = auVar41._4_2_;
    sVar7 = auVar41._6_2_;
    auVar66 = pmaddubsw(auVar49,auVar26);
    auVar49 = pmaddubsw(auVar49,auVar40);
    auVar49 = phaddw(auVar66,auVar49);
    *(uint *)(dst + stride * 4) =
         CONCAT13((0 < sVar7) * (sVar7 < 0x100) * auVar41[6] - (0xff < sVar7),
                  CONCAT12((0 < sVar6) * (sVar6 < 0x100) * auVar41[4] - (0xff < sVar6),
                           CONCAT11((0 < sVar5) * (sVar5 < 0x100) * auVar41[2] - (0xff < sVar5),
                                    (0 < sVar4) * (sVar4 < 0x100) * auVar41[0] - (0xff < sVar4))));
    auVar41 = phaddw(auVar49,auVar49);
    auVar79._0_2_ = auVar41._0_2_ + sVar25;
    auVar79._2_2_ = auVar41._2_2_ + sVar28;
    auVar79._4_2_ = auVar41._4_2_ + sVar29;
    auVar79._6_2_ = auVar41._6_2_ + sVar30;
    auVar79._8_2_ = auVar41._8_2_ + sVar31;
    auVar79._10_2_ = auVar41._10_2_ + sVar32;
    auVar79._12_2_ = auVar41._12_2_ + sVar33;
    auVar79._14_2_ = auVar41._14_2_ + sVar34;
    auVar41 = psraw(auVar79,4);
    sVar4 = auVar41._0_2_;
    sVar5 = auVar41._2_2_;
    sVar6 = auVar41._4_2_;
    sVar7 = auVar41._6_2_;
    auVar80._0_4_ =
         CONCAT13((0 < sVar7) * (sVar7 < 0x100) * auVar41[6] - (0xff < sVar7),
                  CONCAT12((0 < sVar6) * (sVar6 < 0x100) * auVar41[4] - (0xff < sVar6),
                           CONCAT11((0 < sVar5) * (sVar5 < 0x100) * auVar41[2] - (0xff < sVar5),
                                    (0 < sVar4) * (sVar4 < 0x100) * auVar41[0] - (0xff < sVar4))));
    sVar8 = auVar41._8_2_;
    auVar80[4] = (0 < sVar8) * (sVar8 < 0x100) * auVar41[8] - (0xff < sVar8);
    sVar9 = auVar41._10_2_;
    auVar80[5] = (0 < sVar9) * (sVar9 < 0x100) * auVar41[10] - (0xff < sVar9);
    sVar10 = auVar41._12_2_;
    auVar80[6] = (0 < sVar10) * (sVar10 < 0x100) * auVar41[0xc] - (0xff < sVar10);
    sVar11 = auVar41._14_2_;
    auVar80[7] = (0 < sVar11) * (sVar11 < 0x100) * auVar41[0xe] - (0xff < sVar11);
    auVar80[8] = (0 < sVar4) * (sVar4 < 0x100) * auVar41[0] - (0xff < sVar4);
    auVar80[9] = (0 < sVar5) * (sVar5 < 0x100) * auVar41[2] - (0xff < sVar5);
    auVar80[10] = (0 < sVar6) * (sVar6 < 0x100) * auVar41[4] - (0xff < sVar6);
    auVar80[0xb] = (0 < sVar7) * (sVar7 < 0x100) * auVar41[6] - (0xff < sVar7);
    auVar80[0xc] = (0 < sVar8) * (sVar8 < 0x100) * auVar41[8] - (0xff < sVar8);
    auVar80[0xd] = (0 < sVar9) * (sVar9 < 0x100) * auVar41[10] - (0xff < sVar9);
    auVar80[0xe] = (0 < sVar10) * (sVar10 < 0x100) * auVar41[0xc] - (0xff < sVar10);
    auVar80[0xf] = (0 < sVar11) * (sVar11 < 0x100) * auVar41[0xe] - (0xff < sVar11);
    *(undefined4 *)(dst + stride * 5) = auVar80._0_4_;
    auVar41 = pshufb(auVar80,auVar27);
    auVar27 = pshufb(auVar38,_DAT_005604d0);
    auVar27 = auVar27 | auVar41;
    auVar41 = pmaddubsw(auVar27,auVar24);
    auVar24 = pmaddubsw(auVar27,auVar39);
    auVar24 = phaddw(auVar41,auVar24);
    auVar24 = phaddw(auVar24,auVar24);
    auVar48._0_2_ = auVar24._0_2_ + sVar25;
    auVar48._2_2_ = auVar24._2_2_ + sVar28;
    auVar48._4_2_ = auVar24._4_2_ + sVar29;
    auVar48._6_2_ = auVar24._6_2_ + sVar30;
    auVar48._8_2_ = auVar24._8_2_ + sVar31;
    auVar48._10_2_ = auVar24._10_2_ + sVar32;
    auVar48._12_2_ = auVar24._12_2_ + sVar33;
    auVar48._14_2_ = auVar24._14_2_ + sVar34;
    auVar24 = psraw(auVar48,4);
    sVar4 = auVar24._0_2_;
    sVar5 = auVar24._2_2_;
    sVar6 = auVar24._4_2_;
    sVar7 = auVar24._6_2_;
    *(uint *)(dst + stride * 6) =
         CONCAT13((0 < sVar7) * (sVar7 < 0x100) * auVar24[6] - (0xff < sVar7),
                  CONCAT12((0 < sVar6) * (sVar6 < 0x100) * auVar24[4] - (0xff < sVar6),
                           CONCAT11((0 < sVar5) * (sVar5 < 0x100) * auVar24[2] - (0xff < sVar5),
                                    (0 < sVar4) * (sVar4 < 0x100) * auVar24[0] - (0xff < sVar4))));
    auVar24 = pmaddubsw(auVar27,auVar26);
    auVar39 = pmaddubsw(auVar27,auVar40);
    auVar24 = phaddw(auVar24,auVar39);
    auVar24 = phaddw(auVar24,auVar24);
    auVar39._0_2_ = auVar24._0_2_ + sVar25;
    auVar39._2_2_ = auVar24._2_2_ + sVar28;
    auVar39._4_2_ = auVar24._4_2_ + sVar29;
    auVar39._6_2_ = auVar24._6_2_ + sVar30;
    auVar39._8_2_ = auVar24._8_2_ + sVar31;
    auVar39._10_2_ = auVar24._10_2_ + sVar32;
    auVar39._12_2_ = auVar24._12_2_ + sVar33;
    auVar39._14_2_ = auVar24._14_2_ + sVar34;
    auVar24 = psraw(auVar39,4);
    sVar4 = auVar24._0_2_;
    sVar5 = auVar24._2_2_;
    sVar6 = auVar24._4_2_;
    sVar7 = auVar24._6_2_;
    *(uint *)(dst + stride * 7) =
         CONCAT13((0 < sVar7) * (sVar7 < 0x100) * auVar24[6] - (0xff < sVar7),
                  CONCAT12((0 < sVar6) * (sVar6 < 0x100) * auVar24[4] - (0xff < sVar6),
                           CONCAT11((0 < sVar5) * (sVar5 < 0x100) * auVar24[2] - (0xff < sVar5),
                                    (0 < sVar4) * (sVar4 < 0x100) * auVar24[0] - (0xff < sVar4))));
  }
  return;
}

Assistant:

void av1_filter_intra_predictor_sse4_1(uint8_t *dst, ptrdiff_t stride,
                                       TX_SIZE tx_size, const uint8_t *above,
                                       const uint8_t *left, int mode) {
  const int bw = tx_size_wide[tx_size];
  const int bh = tx_size_high[tx_size];
  filter_intra_predictor_sse4_1(dst, stride, above, left, mode, bw, bh);
}